

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O3

Float __thiscall
pbrt::TrowbridgeReitzDistribution::D(TrowbridgeReitzDistribution *this,Vector3f *wm)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  undefined8 uVar7;
  bool bVar8;
  byte bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  fVar1 = (wm->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar1 = fVar1 * fVar1;
  fVar11 = 0.0;
  auVar14 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar1)),ZEXT816(0));
  fVar12 = auVar14._0_4_ / fVar1;
  if ((ABS(fVar12) != INFINITY) && (1e-16 <= fVar1 * fVar1)) {
    auVar14 = vsqrtss_avx(auVar14,auVar14);
    fVar11 = 0.0;
    if ((auVar14._0_4_ != 0.0) || (NAN(auVar14._0_4_))) {
      uVar3 = (wm->super_Tuple3<pbrt::Vector3,_float>).x;
      uVar4 = (wm->super_Tuple3<pbrt::Vector3,_float>).y;
      auVar15._4_4_ = uVar4;
      auVar15._0_4_ = uVar3;
      auVar15._8_8_ = 0;
      auVar14._4_4_ = auVar14._0_4_;
      auVar14._8_4_ = auVar14._0_4_;
      auVar14._12_4_ = auVar14._0_4_;
      fVar10 = this->alpha_x;
      auVar14 = vdivps_avx(auVar15,auVar14);
      auVar5._8_4_ = 0x3f800000;
      auVar5._0_8_ = 0x3f8000003f800000;
      auVar5._12_4_ = 0x3f800000;
      uVar6 = vcmpps_avx512vl(auVar14,auVar5,0xe);
      uVar7 = vcmpss_avx512f(auVar14,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar8 = (bool)((byte)uVar7 & 1);
      auVar5 = vmovshdup_avx(auVar14);
      bVar9 = (byte)(uVar6 >> 1);
      fVar13 = (float)((uint)bVar8 * -0x40800000 +
                      (uint)!bVar8 *
                      ((uint)((byte)uVar6 & 1) * 0x3f800000 +
                      (uint)!(bool)((byte)uVar6 & 1) * auVar14._0_4_));
      uVar7 = vcmpss_avx512f(auVar5,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar8 = (bool)((byte)uVar7 & 1);
      fVar11 = (float)((uint)bVar8 * -0x40800000 +
                      (uint)!bVar8 *
                      ((uint)(bVar9 & 1) * 0x3f800000 + (uint)!(bool)(bVar9 & 1) * auVar5._0_4_));
      fVar13 = (fVar13 * fVar13) / (fVar10 * fVar10);
    }
    else {
      fVar10 = this->alpha_x;
      fVar13 = 1.0 / (fVar10 * fVar10);
    }
    fVar2 = this->alpha_y;
    fVar11 = fVar12 * (fVar13 + (fVar11 * fVar11) / (fVar2 * fVar2)) + 1.0;
    fVar11 = 1.0 / (fVar1 * fVar1 * fVar10 * 3.1415927 * fVar2 * fVar11 * fVar11);
  }
  return fVar11;
}

Assistant:

PBRT_CPU_GPU inline Float D(const Vector3f &wm) const {
        Float tan2Theta = Tan2Theta(wm);
        if (IsInf(tan2Theta))
            return 0;
        Float cos4Theta = Cos2Theta(wm) * Cos2Theta(wm);
        if (cos4Theta < 1e-16f)
            return 0;
        Float e =
            tan2Theta * (Sqr(CosPhi(wm)) / Sqr(alpha_x) + Sqr(SinPhi(wm)) / Sqr(alpha_y));
        return 1 / (Pi * alpha_x * alpha_y * cos4Theta * Sqr(1 + e));
    }